

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::double_writer>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
           *this,align_spec *spec,double_writer *f)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char __tmp;
  char local_62;
  char local_61;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_60;
  ulong local_50;
  double_writer *local_48;
  ulong local_40;
  ostream_iterator<char,_char,_std::char_traits<char>_> *local_38;
  
  uVar7 = (ulong)spec->width_;
  sVar1 = f->buffer->size_;
  uVar6 = (ulong)(f->sign != '\0');
  uVar4 = uVar6 + sVar1;
  uVar5 = uVar7 - uVar4;
  if (uVar7 < uVar4 || uVar5 == 0) {
    double_writer::operator()
              ((double_writer *)f,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
    return;
  }
  local_62 = (char)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar3 = uVar5 >> 1;
    local_60._M_stream = *(ostream_type **)this;
    local_60._M_string = *(char **)(this + 8);
    uVar4 = uVar3;
    local_61 = local_62;
    if (1 < uVar5) {
      local_50 = uVar3;
      local_48 = f;
      local_40 = uVar7;
      local_38 = (ostream_iterator<char,_char,_std::char_traits<char>_> *)this;
      do {
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_60,&local_62);
        uVar3 = uVar3 - 1;
        f = local_48;
        uVar4 = local_50;
        this = (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                *)local_38;
        uVar7 = local_40;
      } while (uVar3 != 0);
    }
    ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_stream = local_60._M_stream;
    ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_string = local_60._M_string;
    double_writer::operator()
              ((double_writer *)f,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
    local_60._M_stream = ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_stream;
    local_60._M_string = ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_string;
    local_62 = local_61;
    if (uVar5 != uVar4) {
      lVar2 = (sVar1 + uVar4 + uVar6) - uVar7;
      do {
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_60,&local_62);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0);
    }
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      local_60._M_stream = *(ostream_type **)this;
      local_60._M_string = *(char **)(this + 8);
      if (uVar5 != 0) {
        lVar2 = uVar4 - uVar7;
        do {
          std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_60,&local_62)
          ;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0);
      }
      *(ostream_type **)this = local_60._M_stream;
      *(char **)(this + 8) = local_60._M_string;
      double_writer::operator()
                ((double_writer *)f,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
      return;
    }
    double_writer::operator()
              ((double_writer *)f,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
    local_60._M_stream = *(ostream_type **)this;
    local_60._M_string = *(char **)(this + 8);
    if (uVar5 != 0) {
      lVar2 = uVar4 - uVar7;
      do {
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_60,&local_62);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0);
    }
  }
  ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_stream = local_60._M_stream;
  ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_string = local_60._M_string;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }